

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O1

void printerror(int status)

{
  int iVar1;
  char errmsg [81];
  char status_str [31];
  undefined1 auStack_a8 [96];
  undefined1 local_48 [40];
  
  if (status != 0) {
    fwrite("\n*** Error occurred during program execution ***\n",0x31,1,_stderr);
  }
  ffgerr(status,local_48);
  fprintf(_stderr,"\nstatus = %d: %s\n",(ulong)(uint)status,local_48);
  iVar1 = ffgmsg(auStack_a8);
  if (iVar1 != 0) {
    fwrite("\nError message stack:\n",0x16,1,_stderr);
    fprintf(_stderr," %s\n",auStack_a8);
    iVar1 = ffgmsg(auStack_a8);
    while (iVar1 != 0) {
      fprintf(_stderr," %s\n",auStack_a8);
      iVar1 = ffgmsg(auStack_a8);
    }
  }
  exit(status);
}

Assistant:

void printerror( int status)
{
    /*****************************************************/
    /* Print out cfitsio error messages and exit program */
    /*****************************************************/

    char status_str[FLEN_STATUS], errmsg[FLEN_ERRMSG];
  
    if (status)
      fprintf(stderr, "\n*** Error occurred during program execution ***\n");

    fits_get_errstatus(status, status_str);   /* get the error description */
    fprintf(stderr, "\nstatus = %d: %s\n", status, status_str);

    /* get first message; null if stack is empty */
    if ( fits_read_errmsg(errmsg) ) 
    {
         fprintf(stderr, "\nError message stack:\n");
         fprintf(stderr, " %s\n", errmsg);

         while ( fits_read_errmsg(errmsg) )  /* get remaining messages */
             fprintf(stderr, " %s\n", errmsg);
    }

    exit( status );       /* terminate the program, returning error status */
}